

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall
qclab::dense::SquareMatrix<float>::SquareMatrix
          (SquareMatrix<float> *this,float m00,float m01,float m02,float m03,float m10,float m11,
          float m12,float m13,float m20,float m21,float m22,float m23,float m30,float m31,float m32,
          float m33)

{
  float *pfVar1;
  
  this->size_ = 4;
  alloc_unique_array<float>((dense *)&this->data_,0x10);
  pfVar1 = (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  *pfVar1 = m00;
  pfVar1[1] = m10;
  pfVar1[2] = m20;
  pfVar1[3] = m30;
  pfVar1[4] = m01;
  pfVar1[5] = m11;
  pfVar1[6] = m21;
  pfVar1[7] = m31;
  pfVar1[8] = m02;
  pfVar1[9] = m12;
  pfVar1[10] = m22;
  pfVar1[0xb] = m32;
  pfVar1[0xc] = m03;
  pfVar1[0xd] = m13;
  pfVar1[0xe] = m23;
  pfVar1[0xf] = m33;
  return;
}

Assistant:

SquareMatrix( const T m00 , const T m01 , const T m02 , const T m03 ,
                      const T m10 , const T m11 , const T m12 , const T m13 ,
                      const T m20 , const T m21 , const T m22 , const T m23 ,
                      const T m30 , const T m31 , const T m32 , const T m33 )
        : size_( 4 )
        , data_( alloc_unique_array< T >( 16 ) )
        {
          data_[ 0] = m00 ; data_[ 1] = m10 ; data_[ 2] = m20 ; data_[ 3] = m30;
          data_[ 4] = m01 ; data_[ 5] = m11 ; data_[ 6] = m21 ; data_[ 7] = m31;
          data_[ 8] = m02 ; data_[ 9] = m12 ; data_[10] = m22 ; data_[11] = m32;
          data_[12] = m03 ; data_[13] = m13 ; data_[14] = m23 ; data_[15] = m33;
        }